

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_sound.cpp
# Opt level: O2

void I_InitSound(void)

{
  char *__s1;
  int iVar1;
  undefined **ppuVar2;
  
  iVar1 = DArgs::CheckParm(Args,"-nosound",1);
  nosound = iVar1 != 0;
  iVar1 = DArgs::CheckParm(Args,"-nosfx",1);
  __s1 = snd_backend.Value;
  nosfx = iVar1 != 0;
  GSnd = (SoundRenderer *)0x0;
  if ((nosound != false) || (batchrun == true)) {
    GSnd = (SoundRenderer *)operator_new(8);
    GSnd->_vptr_SoundRenderer = (_func_int **)&PTR__SoundRenderer_006ea150;
    I_InitMusic();
    return;
  }
  iVar1 = strcasecmp(snd_backend.Value,"null");
  if (iVar1 == 0) {
    GSnd = (SoundRenderer *)operator_new(8);
    ppuVar2 = &PTR__SoundRenderer_006ea150;
    GSnd->_vptr_SoundRenderer = (_func_int **)&PTR__SoundRenderer_006ea150;
LAB_003558d6:
    iVar1 = (*((_func_int **)ppuVar2)[0x1b])();
    if ((char)iVar1 != '\0') goto LAB_0035590c;
  }
  else {
    iVar1 = strcasecmp(__s1,"fmod");
    if (iVar1 != 0) {
      iVar1 = strcasecmp(__s1,"openal");
      if (iVar1 != 0) {
        Printf("\x1cG%s: Unknown sound system specified\n",__s1);
        FStringCVar::operator=(&snd_backend,"null");
        if (GSnd != (SoundRenderer *)0x0) {
          ppuVar2 = GSnd->_vptr_SoundRenderer;
          goto LAB_003558d6;
        }
      }
    }
  }
  I_CloseSound();
  GSnd = (SoundRenderer *)operator_new(8);
  GSnd->_vptr_SoundRenderer = (_func_int **)&PTR__SoundRenderer_006ea150;
  Printf("\x1cGSound init failed. Using nosound.\n");
LAB_0035590c:
  I_InitMusic();
  if (snd_sfxvolume.super_FBaseCVar.m_Callback != (_func_void_FBaseCVar_ptr *)0x0) {
    (*snd_sfxvolume.super_FBaseCVar.m_Callback)(&snd_sfxvolume.super_FBaseCVar);
    return;
  }
  return;
}

Assistant:

void I_InitSound ()
{
	/* Get command line options: */
	nosound = !!Args->CheckParm ("-nosound");
	nosfx = !!Args->CheckParm ("-nosfx");

	GSnd = NULL;
	if (nosound || batchrun)
	{
		GSnd = new NullSoundRenderer;
		I_InitMusic ();
		return;
	}

	// This has been extended to allow falling back from FMod to OpenAL and vice versa if the currently active sound system cannot be found.
	if (stricmp(snd_backend, "null") == 0)
	{
		GSnd = new NullSoundRenderer;
	}
	else if(stricmp(snd_backend, "fmod") == 0)
	{
		#ifndef NO_FMOD
			if (IsFModExPresent())
			{
				GSnd = new FMODSoundRenderer;
			}
		#endif
		#ifndef NO_OPENAL
			if ((!GSnd || !GSnd->IsValid()) && IsOpenALPresent())
			{
				Printf (TEXTCOLOR_RED"FMod Ex Sound init failed. Trying OpenAL.\n");
				I_CloseSound();
				GSnd = new OpenALSoundRenderer;
				snd_backend = "openal";
			}
		#endif
	}
	else if(stricmp(snd_backend, "openal") == 0)
	{
		#ifndef NO_OPENAL
			if (IsOpenALPresent())
			{
				GSnd = new OpenALSoundRenderer;
			}
		#endif
		#ifndef NO_FMOD
			if ((!GSnd || !GSnd->IsValid()) && IsFModExPresent())
			{
				Printf (TEXTCOLOR_RED"OpenAL Sound init failed. Trying FMod Ex.\n");
				I_CloseSound();
				GSnd = new FMODSoundRenderer;
				snd_backend = "fmod";
			}
		#endif
	}
	else
	{
		Printf (TEXTCOLOR_RED"%s: Unknown sound system specified\n", *snd_backend);
		snd_backend = "null";
	}
	if (!GSnd || !GSnd->IsValid ())
	{
		I_CloseSound();
		GSnd = new NullSoundRenderer;
		Printf (TEXTCOLOR_RED"Sound init failed. Using nosound.\n");
	}
	I_InitMusic ();
	snd_sfxvolume.Callback ();
}